

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

CppDirective cpp_directive(Env *env)

{
  _Bool _Var1;
  uint32_t start_00;
  uint32_t start;
  Env *env_local;
  
  _Var1 = char0(env,0x23);
  if (_Var1) {
    start_00 = take_space_from(env,1);
    _Var1 = cpp_cond_start(env,start_00);
    if (_Var1) {
      env_local._4_4_ = CppStart;
    }
    else {
      _Var1 = cpp_cond_else(env,start_00);
      if (_Var1) {
        env_local._4_4_ = CppElse;
      }
      else {
        _Var1 = cpp_cond_end(env,start_00);
        if (_Var1) {
          env_local._4_4_ = CppEnd;
        }
        else {
          _Var1 = cpp_directive_other(env,start_00);
          if (_Var1) {
            env_local._4_4_ = CppOther;
          }
          else {
            env_local._4_4_ = CppNothing;
          }
        }
      }
    }
  }
  else {
    env_local._4_4_ = CppNothing;
  }
  return env_local._4_4_;
}

Assistant:

static CppDirective cpp_directive(Env *env) {
  if (!char0(env, '#')) return CppNothing;
  uint32_t start = take_space_from(env, 1);
  if (cpp_cond_start(env, start)) return CppStart;
  else if (cpp_cond_else(env, start)) return CppElse;
  else if (cpp_cond_end(env, start)) return CppEnd;
  else if (cpp_directive_other(env, start)) return CppOther;
  else return CppNothing;
}